

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O1

void get_msurf_descriptor_gauss_s2_precomputed(integral_image *iimage,interest_point *ipoint)

{
  bool bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int s;
  int iVar8;
  int col;
  int iVar10;
  int row;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float __x;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 in_register_00001444 [12];
  int local_dc;
  float local_98;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  long lVar9;
  undefined1 extraout_var [60];
  
  auVar18._8_4_ = 0x80000000;
  auVar18._0_8_ = 0x8000000080000000;
  auVar18._12_4_ = 0x80000000;
  fVar17 = ipoint->scale;
  auVar36 = ZEXT464((uint)fVar17);
  auVar13._8_4_ = 0x3effffff;
  auVar13._0_8_ = 0x3effffff3effffff;
  auVar13._12_4_ = 0x3effffff;
  auVar11 = vpternlogd_avx512vl(auVar13,ZEXT416((uint)fVar17),auVar18,0xf8);
  auVar11 = ZEXT416((uint)(fVar17 + auVar11._0_4_));
  auVar11 = vroundss_avx(auVar11,auVar11,0xb);
  s = (int)(auVar11._0_4_ + auVar11._0_4_);
  auVar11 = vpternlogd_avx512vl(auVar13,ZEXT416((uint)ipoint->x),auVar18,0xf8);
  auVar11 = ZEXT416((uint)(ipoint->x + auVar11._0_4_));
  auVar11 = vroundss_avx(auVar11,auVar11,0xb);
  auVar29._0_8_ = (double)auVar11._0_4_;
  auVar29._8_8_ = auVar11._8_8_;
  auVar14._0_8_ = (double)fVar17;
  auVar14._8_8_ = 0;
  auVar29 = vfmadd231sd_fma(auVar29,auVar14,ZEXT816(0x3fe0000000000000));
  auVar37 = ZEXT1664(CONCAT124(auVar29._4_12_,(float)auVar29._0_8_));
  auVar11 = vpternlogd_avx512vl(auVar13,ZEXT416((uint)ipoint->y),auVar18,0xf8);
  auVar11 = ZEXT416((uint)(ipoint->y + auVar11._0_4_));
  auVar11 = vroundss_avx(auVar11,auVar11,0xb);
  auVar12._0_8_ = (double)auVar11._0_4_;
  auVar12._8_8_ = auVar11._8_8_;
  auVar11 = vfmadd231sd_fma(auVar12,auVar14,ZEXT816(0x3fe0000000000000));
  __x = 0.0;
  iVar10 = 0;
  auVar34 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
  auVar35 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
  lVar6 = 0;
  lVar9 = 0;
  iVar3 = -8;
  do {
    auVar30._0_4_ = (float)iVar3;
    auVar30._4_12_ = in_register_00001444;
    auVar18 = vfmadd213ss_fma(auVar30,auVar36._0_16_,auVar37._0_16_);
    auVar12 = vpternlogd_avx512vl(auVar34._0_16_,auVar18,auVar35._0_16_,0xf8);
    auVar18 = ZEXT416((uint)(auVar18._0_4_ + auVar12._0_4_));
    auVar18 = vroundss_avx(auVar18,auVar18,0xb);
    auVar27._0_4_ = (int)auVar18._0_4_;
    auVar27._4_4_ = (int)auVar18._4_4_;
    auVar27._8_4_ = (int)auVar18._8_4_;
    auVar27._12_4_ = (int)auVar18._12_4_;
    auVar18 = vcvtdq2ps_avx(auVar27);
    lVar6 = (long)(int)lVar6;
    iVar8 = (int)lVar9;
    lVar9 = (long)iVar8;
    local_dc = -3;
    iVar5 = -8;
    do {
      auVar19._0_4_ = (float)iVar5;
      auVar19._4_12_ = in_register_00001444;
      auVar12 = vfmadd213ss_fma(auVar19,auVar36._0_16_,ZEXT416((uint)(float)auVar11._0_8_));
      auVar13 = vpternlogd_avx512vl(auVar34._0_16_,auVar12,auVar35._0_16_,0xf8);
      auVar12 = ZEXT416((uint)(auVar12._0_4_ + auVar13._0_4_));
      auVar12 = vroundss_avx(auVar12,auVar12,0xb);
      iVar4 = iVar5 + -4;
      auVar20._0_4_ = (int)auVar12._0_4_;
      auVar20._4_4_ = (int)auVar12._4_4_;
      auVar20._8_4_ = (int)auVar12._8_4_;
      auVar20._12_4_ = (int)auVar12._12_4_;
      auVar12 = vcvtdq2ps_avx(auVar20);
      auVar33 = ZEXT1664(ZEXT816(0) << 0x40);
      do {
        auVar21._0_4_ = (float)iVar4;
        auVar21._4_12_ = in_register_00001444;
        auVar13 = vfmadd213ss_fma(auVar21,auVar36._0_16_,ZEXT416((uint)(float)auVar11._0_8_));
        auVar14 = vpternlogd_avx512vl(auVar34._0_16_,auVar13,auVar35._0_16_,0xf8);
        auVar13 = ZEXT416((uint)(auVar13._0_4_ + auVar14._0_4_));
        auVar13 = vroundss_avx(auVar13,auVar13,0xb);
        row = (int)auVar13._0_4_;
        auVar22._0_4_ = (int)auVar13._0_4_;
        auVar22._4_4_ = (int)auVar13._4_4_;
        auVar22._8_4_ = (int)auVar13._8_4_;
        auVar22._12_4_ = (int)auVar13._12_4_;
        auVar13 = vcvtdq2ps_avx(auVar22);
        local_98 = auVar12._0_4_;
        local_98 = local_98 - auVar13._0_4_;
        iVar7 = -0xc;
        do {
          auVar23._0_4_ = (float)(iVar10 + iVar7);
          auVar23._4_12_ = in_register_00001444;
          auVar13 = vfmadd213ss_fma(auVar23,auVar36._0_16_,auVar37._0_16_);
          auVar14 = vpternlogd_avx512vl(auVar34._0_16_,auVar13,auVar35._0_16_,0xf8);
          auVar13 = ZEXT416((uint)(auVar13._0_4_ + auVar14._0_4_));
          auVar13 = vroundss_avx(auVar13,auVar13,0xb);
          col = (int)auVar13._0_4_;
          auVar24._0_4_ = (int)auVar13._0_4_;
          auVar24._4_4_ = (int)auVar13._4_4_;
          auVar24._8_4_ = (int)auVar13._8_4_;
          auVar24._12_4_ = (int)auVar13._12_4_;
          auVar13 = vcvtdq2ps_avx(auVar24);
          fVar15 = auVar18._0_4_ - auVar13._0_4_;
          fVar15 = expf((-0.08 / (fVar17 * fVar17)) * (fVar15 * fVar15 + local_98 * local_98));
          fVar16 = haarX_improved(iimage,row,col,s);
          auVar26._0_4_ = haarY_improved(iimage,row,col,s);
          auVar26._4_60_ = extraout_var;
          auVar31._8_4_ = 0x7fffffff;
          auVar31._0_8_ = 0x7fffffff7fffffff;
          auVar31._12_4_ = 0x7fffffff;
          auVar35 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          auVar34 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
          auVar37 = ZEXT464((uint)(float)auVar29._0_8_);
          auVar36 = ZEXT1664(ZEXT416((uint)fVar17));
          auVar13 = vinsertps_avx(auVar26._0_16_,ZEXT416((uint)fVar16),0x10);
          auVar25._0_4_ = fVar15 * auVar13._0_4_;
          auVar25._4_4_ = fVar15 * auVar13._4_4_;
          auVar25._8_4_ = fVar15 * auVar13._8_4_;
          auVar25._12_4_ = fVar15 * auVar13._12_4_;
          auVar13 = vandps_avx(auVar25,auVar31);
          local_48 = auVar33._0_4_;
          fStack_44 = auVar33._4_4_;
          fStack_40 = auVar33._8_4_;
          fStack_3c = auVar33._12_4_;
          auVar13 = vmovlhps_avx(auVar25,auVar13);
          auVar32._0_4_ = local_48 + auVar13._0_4_;
          auVar32._4_4_ = fStack_44 + auVar13._4_4_;
          auVar32._8_4_ = fStack_40 + auVar13._8_4_;
          auVar32._12_4_ = fStack_3c + auVar13._12_4_;
          auVar33 = ZEXT1664(auVar32);
          iVar7 = iVar7 + 1;
        } while (iVar7 != -3);
        iVar4 = iVar4 + 1;
      } while (iVar4 != local_dc);
      iVar5 = iVar5 + 5;
      fVar15 = gauss_s2_arr[lVar9];
      auVar2._4_4_ = fVar15;
      auVar2._0_4_ = fVar15;
      auVar2._8_4_ = fVar15;
      auVar2._12_4_ = fVar15;
      auVar14 = vmulps_avx512vl(auVar32,auVar2);
      lVar9 = lVar9 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar6) = auVar14;
      auVar28._0_4_ = auVar14._0_4_ * auVar14._0_4_;
      auVar28._4_4_ = auVar14._4_4_ * auVar14._4_4_;
      auVar28._8_4_ = auVar14._8_4_ * auVar14._8_4_;
      auVar28._12_4_ = auVar14._12_4_ * auVar14._12_4_;
      auVar12 = vmovshdup_avx(auVar28);
      auVar13 = vfmadd231ss_fma(auVar12,auVar14,auVar14);
      auVar12 = vshufpd_avx(auVar14,auVar14,1);
      auVar13 = vfmadd213ss_fma(auVar12,auVar12,auVar13);
      auVar12 = vshufps_avx(auVar14,auVar14,0xff);
      auVar12 = vfmadd213ss_fma(auVar12,auVar12,auVar13);
      __x = __x + auVar12._0_4_;
      lVar6 = lVar6 + 4;
      local_dc = local_dc + 5;
    } while (iVar8 + 4 != (int)lVar9);
    iVar10 = iVar10 + 5;
    bVar1 = iVar3 < 3;
    iVar3 = iVar3 + 5;
  } while (bVar1);
  if (__x < 0.0) {
    fVar17 = sqrtf(__x);
  }
  else {
    auVar11 = vsqrtss_avx(ZEXT416((uint)__x),ZEXT416((uint)__x));
    fVar17 = auVar11._0_4_;
  }
  auVar34 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar17)));
  lVar6 = 0;
  do {
    auVar35 = vmulps_avx512f(auVar34,*(undefined1 (*) [64])(ipoint->descriptor + lVar6));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar6) = auVar35;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_gauss_s2_precomputed(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_descriptor_inlined
        - use array gauss_s2_precomputed and index gauss_s2_index for precomputed gauss_s2 values

    ideas:
        - 
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale_mul_2 = (int) 2 * roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;
    
     // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        for (int j=-8; j<8; j+=5) {
            
            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int xs = (int) roundf(ipoint_x + i * scale);
            int ys = (int) roundf(ipoint_y + j * scale);

            for (int l = j-4; l < j + 5; ++l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                float ys_sub_sample_y = (float) ys-sample_y;
                float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                for (int k = i-4; k < i + 5; ++k) {

                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    float xs_sub_sample_x = (float) xs-sample_x;
                    float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;

                    //Get the gaussian weighted x and y responses
                    float gauss_s1 = expf(g1_factor * (xs_sub_sample_x_squared + ys_sub_sample_y_squared));
                    
                    float rx = haarX_improved(iimage, sample_y, sample_x, int_scale_mul_2);
                    float ry = haarY_improved(iimage, sample_y, sample_x, int_scale_mul_2);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_precomputed[gauss_s2_index++];

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}